

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

void cleanup_meth(void)

{
  blow_message *p;
  blow_message *pbVar1;
  blow_method *pbVar2;
  
  pbVar2 = blow_methods + 1;
  do {
    p = pbVar2->messages;
    string_free(pbVar2->desc);
    while (p != (blow_message *)0x0) {
      pbVar1 = p->next;
      string_free(p->act_msg);
      mem_free(p);
      p = pbVar1;
    }
    string_free(pbVar2->name);
    pbVar2 = pbVar2->next;
  } while (pbVar2 != (blow_method *)0x0);
  mem_free(blow_methods);
  return;
}

Assistant:

static void cleanup_meth(void)
{
	struct blow_method *meth = &blow_methods[1];

	while (meth) {
		struct blow_message *msg = meth->messages;
		string_free(meth->desc);
		while (msg) {
			struct blow_message *next = msg->next;
			string_free(msg->act_msg);
			mem_free(msg);
			msg = next;
		}
		string_free(meth->name);
		meth = meth->next;
	}
	mem_free(blow_methods);
}